

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::zmqBrokerServer::stopServer(zmqBrokerServer *this)

{
  string_view message;
  string_view message_00;
  undefined1 uVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  size_t __n;
  sockaddr *__addr;
  int __fd;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_RDI;
  int in_R8D;
  lock_guard<std::mutex> tlock;
  error_t *anon_var_0;
  value_type V_1;
  value_type V;
  int port;
  socket_t reqSocket;
  shared_ptr<ZmqContextManager> ctx;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  mutex_type *__m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  socket_t *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  uint in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  uint uVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *other;
  string *in_stack_fffffffffffffe48;
  mutex_type local_181;
  undefined1 local_140 [39];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f1;
  allocator<char> local_b9 [40];
  allocator<char> local_91 [49];
  uint local_60;
  undefined4 local_5c;
  socket_t local_58 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_38 [3];
  
  CLI::std::atomic<bool>::store
            ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0),
             (memory_order)in_stack_fffffffffffffdf0);
  if (((in_RDI[6].m_data.m_type & object) != null) || ((in_RDI[6].m_data.field_0x1 & 1) != 0)) {
    other = local_38;
    std::__cxx11::string::string(in_stack_fffffffffffffdf0);
    ZmqContextManager::getContextPointer(in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    CLI::std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f603a);
    this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)ZmqContextManager::getBaseContext((ZmqContextManager *)0x1f6042);
    zmq::socket_t::socket_t
              (in_stack_fffffffffffffe00,
               (context_t *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    local_5c = 300;
    zmq::detail::socket_base::setsockopt<int>
              ((socket_base *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,(int *)0x1f6098);
    if (*(int *)&in_RDI[6].m_data.field_0x4 == 0) {
      if ((in_RDI[6].m_data.m_type & object) == null) {
        in_stack_fffffffffffffe20 = getDefaultPort(10);
        in_stack_fffffffffffffe24 = in_stack_fffffffffffffe20;
        uVar2 = in_stack_fffffffffffffe20;
      }
      else {
        in_stack_fffffffffffffe28 = getDefaultPort(1);
        in_stack_fffffffffffffe24 = in_stack_fffffffffffffe28 + 1U;
        uVar2 = in_stack_fffffffffffffe28 + 1U;
      }
    }
    else {
      uVar2 = *(uint *)&in_RDI[6].m_data.field_0x4;
    }
    __n = (size_t)uVar2;
    local_60 = uVar2;
    if ((in_RDI[6].m_data.m_type & object) == null) {
      uVar1 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[6],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffe00,
                         (char (*) [6])CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                        );
      if ((bool)uVar1) {
        in_stack_fffffffffffffdf0 =
             (string *)
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(this_00,(char *)CONCAT44(uVar2,in_stack_fffffffffffffe28));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json(in_RDI,other);
        in_stack_fffffffffffffde8 = &local_f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffffe00,
                   (string *)CONCAT17(uVar1,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        in_stack_fffffffffffffde0 = &local_119;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffffde0,
                   (string *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (int *)0x1f6450);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffde0);
      }
    }
    else {
      in_stack_fffffffffffffe1f =
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[4],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffe00,
                      (char (*) [4])CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      if ((bool)in_stack_fffffffffffffe1f) {
        in_stack_fffffffffffffe10 =
             (allocator<char> *)
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(this_00,(char *)CONCAT44(uVar2,in_stack_fffffffffffffe28));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json(in_RDI,other);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffffe00,
                   (string *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                   in_stack_fffffffffffffdf0);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator(local_91);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10);
        fileops::replaceIfMember
                  ((json *)in_stack_fffffffffffffde0,
                   (string *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (int *)0x1f6220);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator(local_b9);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffde0);
      }
    }
    gmlc::networking::makePortAddress
              ((string *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    zmq::detail::socket_base::connect
              (&local_58[0].super_socket_base,(int)local_140,__addr,(socklen_t)__n);
    std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    __m = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    __fd = (int)&local_181 + 0x21;
    zmq::detail::socket_base::send(&local_58[0].super_socket_base,__fd,(void *)0x0,__n,in_R8D);
    std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    zmq::socket_t::close(local_58,__fd);
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffde0,__m);
    if ((in_RDI[6].m_data.m_type & object) != null) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
                 (char *)in_stack_fffffffffffffde8);
      message._M_str = (char *)in_stack_fffffffffffffde0;
      message._M_len = (size_t)__m;
      TypedBrokerServer::logMessage(message);
    }
    if ((in_RDI[6].m_data.field_0x1 & 1) != 0) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
                 (char *)in_stack_fffffffffffffde8);
      message_00._M_str = (char *)in_stack_fffffffffffffde0;
      message_00._M_len = (size_t)__m;
      TypedBrokerServer::logMessage(message_00);
    }
    std::thread::join();
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f6790);
    zmq::socket_t::~socket_t((socket_t *)0x1f679d);
    CLI::std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x1f67aa);
  }
  return;
}

Assistant:

void zmqBrokerServer::stopServer()
{
    exitAll.store(true);
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (!zmq_enabled_ && !zmqss_enabled_) {
        return;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::socket_t reqSocket(ctx->getBaseContext(), (zmq_enabled_) ? ZMQ_REQ : ZMQ_DEALER);
    reqSocket.setsockopt(ZMQ_LINGER, 300);
    int port = (mZmqPort != 0) ? mZmqPort :
                                 ((zmq_enabled_) ? getDefaultPort(HELICS_CORE_TYPE_ZMQ) + 1 :
                                                   getDefaultPort(HELICS_CORE_TYPE_ZMQ_SS));
    if (zmq_enabled_) {
        if (config_->contains("zmq")) {
            auto V = (*config_)["zmq"];
            fileops::replaceIfMember(V, "interface", mZmqInterface);
            fileops::replaceIfMember(V, "port", port);
        }
    } else {
        if (config_->contains("zmqss")) {
            auto V = (*config_)["zmqss"];
            fileops::replaceIfMember(V, "interface", mZmqInterface);
            fileops::replaceIfMember(V, "port", port);
        }
    }

    try {
        reqSocket.connect(gmlc::networking::makePortAddress(mZmqInterface, port));
        reqSocket.send(std::string("close_server:") + name_);
        reqSocket.close();
    }
    catch (const zmq::error_t&) {
    }

    std::lock_guard<std::mutex> tlock(threadGuard);
    if (zmq_enabled_) {
        logMessage("stopping zmq broker server");
    }
    if (zmqss_enabled_) {
        logMessage("stopping zmq ss broker server");
    }
    mainLoopThread.join();
#endif
}